

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

bool __thiscall crnlib::crn_comp::quantize_images(crn_comp *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  crn_format cVar4;
  level_details *plVar5;
  color_quad<unsigned_char,_int> *pcVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  crn_comp_params *pcVar12;
  color_quad_u8 (*blocks) [16];
  int iVar13;
  uint dy;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  float *pfVar25;
  ulong uVar26;
  float __x;
  float fVar27;
  float fVar28;
  float local_1d0;
  uint y0;
  params local_188;
  
  dxt_hc::params::params(&local_188);
  pcVar12 = this->m_pParams;
  local_188.m_adaptive_tile_alpha_psnr_derating = pcVar12->m_crn_adaptive_tile_alpha_psnr_derating;
  local_188.m_adaptive_tile_color_psnr_derating = pcVar12->m_crn_adaptive_tile_color_psnr_derating;
  if ((pcVar12->m_flags & 0x40) == 0) {
    uVar14 = (pcVar12->m_height + 3 >> 2) * (pcVar12->m_width + 3 >> 2);
    if (0x1fff < uVar14) {
      uVar14 = 0x2000;
    }
    uVar15 = 8;
    if (8 < uVar14) {
      uVar15 = uVar14;
    }
    fVar27 = (float)pcVar12->m_quality_level / 255.0;
    fVar28 = 1.0;
    if (this->m_has_etc_color_blocks == true) {
      if (this->m_has_subblocks == false) {
        fVar28 = 0.7;
        local_188.m_adaptive_tile_color_psnr_derating = 2.0;
      }
      else {
        fVar28 = 1.31;
        local_188.m_adaptive_tile_color_psnr_derating = 5.0;
      }
    }
    __x = 1.0;
    if (fVar27 <= 1.0) {
      __x = fVar27;
    }
    cVar4 = pcVar12->m_format;
    if (cVar4 == cCRNFmtDXT5) {
      fVar28 = 0.75;
LAB_00166182:
      local_1d0 = 1.0;
    }
    else if (cVar4 == cCRNFmtETC2A) {
      local_1d0 = 0.9;
    }
    else {
      if (cVar4 != cCRNFmtDXT5_CCxY) goto LAB_00166182;
      local_188.m_adaptive_tile_color_psnr_derating = 5.0;
      fVar28 = 3.5;
      local_1d0 = 0.35;
    }
    fVar27 = powf(__x,fVar28 * 1.8);
    fVar28 = powf(__x,fVar28 * 1.65);
    local_188.m_color_endpoint_codebook_size =
         (uint)(long)((float)(int)(uVar15 - 0x40) * fVar27 + 64.0 + 0.5);
    if (0x1fff < local_188.m_color_endpoint_codebook_size) {
      local_188.m_color_endpoint_codebook_size = 0x2000;
    }
    if (local_188.m_color_endpoint_codebook_size < 9) {
      local_188.m_color_endpoint_codebook_size = 8;
    }
    local_188.m_color_selector_codebook_size =
         (uint)(long)((float)(int)(uVar15 - 0x60) * fVar28 + 96.0 + 0.5);
    if (0x1fff < local_188.m_color_selector_codebook_size) {
      local_188.m_color_selector_codebook_size = 0x2000;
    }
    if (local_188.m_color_selector_codebook_size < 9) {
      local_188.m_color_selector_codebook_size = 8;
    }
    fVar27 = powf(__x,local_1d0 * 2.1);
    fVar28 = powf(__x,local_1d0 * 1.65);
    local_188.m_alpha_endpoint_codebook_size =
         (uint)(long)((float)(int)(uVar15 - 0x18) * fVar27 + 24.0 + 0.5);
    if (0x1fff < local_188.m_alpha_endpoint_codebook_size) {
      local_188.m_alpha_endpoint_codebook_size = 0x2000;
    }
    if (local_188.m_alpha_endpoint_codebook_size < 9) {
      local_188.m_alpha_endpoint_codebook_size = 8;
    }
    uVar14 = (uint)(long)((float)(int)(uVar15 - 0x30) * fVar28 + 48.0 + 0.5);
    local_188.m_alpha_selector_codebook_size = 0x2000;
    if (uVar14 < 0x2000) {
      local_188.m_alpha_selector_codebook_size = uVar14;
    }
    if (local_188.m_alpha_selector_codebook_size < 9) {
      local_188.m_alpha_selector_codebook_size = 8;
    }
  }
  else {
    local_188.m_color_endpoint_codebook_size = pcVar12->m_crn_color_endpoint_palette_size;
    if (0x1fff < (int)local_188.m_color_endpoint_codebook_size) {
      local_188.m_color_endpoint_codebook_size = 0x2000;
    }
    if ((int)local_188.m_color_endpoint_codebook_size < 9) {
      local_188.m_color_endpoint_codebook_size = 8;
    }
    local_188.m_color_selector_codebook_size = pcVar12->m_crn_color_selector_palette_size;
    if (0x1fff < (int)local_188.m_color_selector_codebook_size) {
      local_188.m_color_selector_codebook_size = 0x2000;
    }
    if ((int)local_188.m_color_selector_codebook_size < 9) {
      local_188.m_color_selector_codebook_size = 8;
    }
    local_188.m_alpha_endpoint_codebook_size = pcVar12->m_crn_alpha_endpoint_palette_size;
    if (0x1fff < (int)local_188.m_alpha_endpoint_codebook_size) {
      local_188.m_alpha_endpoint_codebook_size = 0x2000;
    }
    if ((int)local_188.m_alpha_endpoint_codebook_size < 9) {
      local_188.m_alpha_endpoint_codebook_size = 8;
    }
    local_188.m_alpha_selector_codebook_size = 0x2000;
    if ((int)pcVar12->m_crn_alpha_selector_palette_size < 0x2000) {
      local_188.m_alpha_selector_codebook_size = pcVar12->m_crn_alpha_selector_palette_size;
    }
    if ((int)local_188.m_alpha_selector_codebook_size < 9) {
      local_188.m_alpha_selector_codebook_size = 8;
    }
  }
  if ((int)this->m_pParams->m_flags < 0) {
    console::debug("Color endpoints: %u",(ulong)local_188.m_color_endpoint_codebook_size);
    console::debug("Color selectors: %u",(ulong)local_188.m_color_selector_codebook_size);
    console::debug("Alpha endpoints: %u",(ulong)local_188.m_alpha_endpoint_codebook_size);
    console::debug("Alpha selectors: %u");
  }
  pcVar12 = this->m_pParams;
  bVar1 = (byte)pcVar12->m_flags;
  local_188.m_hierarchical = (bool)(bVar1 >> 1 & 1);
  local_188.m_perceptual = (bool)(bVar1 & 1);
  local_188.m_pProgress_func = pcVar12->m_pProgress_func;
  local_188.m_pProgress_func_data = pcVar12->m_pProgress_func_data;
  switch(pcVar12->m_format) {
  case cCRNFmtDXT1:
    local_188.m_format = cDXT1;
    break;
  case cCRNFmtDXT3:
    this->m_has_comp[1] = true;
    return false;
  case cCRNFmtDXT5:
    local_188.m_format = cDXT5;
    goto LAB_001664ef;
  case cCRNFmtDXT5_CCxY:
    local_188.m_format = cDXT5;
    local_188.m_alpha_component_indices[0] = 3;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    local_188.m_perceptual = false;
    local_188.m_adaptive_tile_color_alpha_weighting_ratio = 1.5;
    goto LAB_00166507;
  case cCRNFmtDXT5_xGxR:
  case cCRNFmtDXT5_xGBR:
  case cCRNFmtDXT5_AGBR:
    local_188.m_format = cDXT5;
    local_188.m_alpha_component_indices[0] = 3;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    goto LAB_0016649d;
  case cCRNFmtDXN_XY:
    local_188.m_format = cDXN_XY;
    local_188.m_alpha_component_indices[0] = 0;
    local_188.m_alpha_component_indices[1] = 1;
    goto LAB_0016646f;
  case cCRNFmtDXN_YX:
    local_188.m_format = cDXN_YX;
    local_188.m_alpha_component_indices[0] = 1;
    local_188.m_alpha_component_indices[1] = 0;
LAB_0016646f:
    this->m_has_comp[1] = true;
    this->m_has_comp[2] = true;
    goto LAB_0016649d;
  case cCRNFmtDXT5A:
    local_188.m_format = cDXT5A;
    local_188.m_alpha_component_indices[0] = pcVar12->m_alpha_component;
    this->m_has_comp[1] = true;
LAB_0016649d:
    local_188.m_perceptual = false;
    goto LAB_00166507;
  case cCRNFmtETC1:
    local_188.m_format = cETC1;
    break;
  case cCRNFmtETC2:
    local_188.m_format = cETC2;
    break;
  case cCRNFmtETC2A:
    local_188.m_format = cETC2A;
    goto LAB_001664ef;
  case cCRNFmtETC1S:
    local_188.m_format = cETC1S;
    break;
  case cCRNFmtETC2AS:
    local_188.m_format = cETC2AS;
LAB_001664ef:
    local_188.m_alpha_component_indices[0] = pcVar12->m_alpha_component;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    goto LAB_00166507;
  default:
    return false;
  }
  this->m_has_comp[0] = true;
LAB_00166507:
  local_188.m_debugging = SUB41(pcVar12->m_flags >> 0x1f,0);
  local_188.m_pTask_pool = &this->m_task_pool;
  local_188.m_num_levels = pcVar12->m_levels;
  pcVar12 = this->m_pParams;
  if (pcVar12->m_levels != 0) {
    lVar19 = 8;
    pfVar25 = &local_188.m_levels[0].m_weight;
    uVar26 = 0;
    do {
      plVar5 = (this->m_levels).m_p;
      ((anon_struct_16_4_e4b8e16b *)(pfVar25 + -3))->m_first_block =
           *(uint *)((long)plVar5 + lVar19 + -8);
      pfVar25[-2] = (float)*(uint *)((long)plVar5 + lVar19 + -4);
      pfVar25[-1] = (float)*(uint *)((long)&plVar5->first_block + lVar19);
      fVar28 = powf(1.3,(float)(uVar26 & 0xffffffff));
      fVar27 = 12.0;
      if (fVar28 <= 12.0) {
        fVar27 = fVar28;
      }
      *pfVar25 = fVar27;
      uVar26 = uVar26 + 1;
      pcVar12 = this->m_pParams;
      lVar19 = lVar19 + 0xc;
      pfVar25 = pfVar25 + 4;
    } while (uVar26 < pcVar12->m_levels);
  }
  local_188.m_num_faces = pcVar12->m_faces;
  local_188.m_num_blocks = this->m_total_blocks;
  blocks = (color_quad_u8 (*) [16])crnlib_malloc((ulong)(local_188.m_num_blocks << 4) << 2);
  if (this->m_pParams->m_levels != 0) {
    uVar26 = 0;
    uVar14 = 0;
    do {
      if (this->m_pParams->m_faces != 0) {
        uVar17 = 0;
        do {
          uVar2 = this->m_images[uVar17][uVar26].m_height;
          uVar15 = uVar2 + 7 >> 2 & 0x3ffffffe;
          if (uVar15 != 0) {
            uVar3 = this->m_images[uVar17][uVar26].m_width;
            uVar8 = uVar3 + 7 >> 2 & 0xfffffffe;
            uVar22 = uVar2 - 1;
            uVar24 = uVar3 - 1;
            uVar9 = 0;
            do {
              if (uVar8 != 0) {
                iVar13 = 0;
                uVar11 = 0;
                do {
                  iVar16 = 0;
                  iVar10 = 0;
                  do {
                    uVar21 = iVar16 + uVar9 * 4;
                    if (uVar22 <= uVar21) {
                      uVar21 = uVar22;
                    }
                    iVar20 = 0;
                    do {
                      uVar23 = iVar10 + iVar20;
                      uVar18 = iVar13 + iVar20;
                      if (uVar24 <= (uint)(iVar13 + iVar20)) {
                        uVar18 = uVar24;
                      }
                      pcVar6 = this->m_images[uVar17][uVar26].m_pPixels;
                      uVar18 = this->m_images[uVar17][uVar26].m_pitch * uVar21 + uVar18;
                      blocks[uVar14][uVar23].field_0.field_0.r = pcVar6[uVar18].field_0.field_0.r;
                      blocks[uVar14][uVar23].field_0.field_0.g = pcVar6[uVar18].field_0.field_0.g;
                      blocks[uVar14][uVar23].field_0.field_0.b = pcVar6[uVar18].field_0.field_0.b;
                      blocks[uVar14][uVar23].field_0.field_0.a = pcVar6[uVar18].field_0.field_0.a;
                      iVar20 = iVar20 + 1;
                    } while (iVar20 != 4);
                    iVar16 = iVar16 + 1;
                    iVar10 = iVar10 + 4;
                  } while (iVar16 != 4);
                  uVar11 = uVar11 + 1;
                  uVar14 = uVar14 + 1;
                  iVar13 = iVar13 + 4;
                } while (uVar11 != uVar8);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar15);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < this->m_pParams->m_faces);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < this->m_pParams->m_levels);
  }
  bVar7 = dxt_hc::compress(&this->m_hvq,blocks,&this->m_endpoint_indices,&this->m_selector_indices,
                           &this->m_color_endpoints,&this->m_alpha_endpoints,
                           &this->m_color_selectors,&this->m_alpha_selectors,&local_188);
  crnlib_free(blocks);
  return bVar7;
}

Assistant:

bool crn_comp::quantize_images()
    {
        dxt_hc::params params;

        params.m_adaptive_tile_alpha_psnr_derating = m_pParams->m_crn_adaptive_tile_alpha_psnr_derating;
        params.m_adaptive_tile_color_psnr_derating = m_pParams->m_crn_adaptive_tile_color_psnr_derating;

        if (m_pParams->m_flags & cCRNCompFlagManualPaletteSizes)
        {
            params.m_color_endpoint_codebook_size = math::clamp<int>(m_pParams->m_crn_color_endpoint_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_color_selector_codebook_size = math::clamp<int>(m_pParams->m_crn_color_selector_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_alpha_endpoint_codebook_size = math::clamp<int>(m_pParams->m_crn_alpha_endpoint_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_alpha_selector_codebook_size = math::clamp<int>(m_pParams->m_crn_alpha_selector_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
        }
        else
        {
            uint max_codebook_entries = ((m_pParams->m_width + 3) / 4) * ((m_pParams->m_height + 3) / 4);

            max_codebook_entries = math::clamp<uint>(max_codebook_entries, cCRNMinPaletteSize, cCRNMaxPaletteSize);

            float quality = math::clamp<float>((float)m_pParams->m_quality_level / cCRNMaxQualityLevel, 0.0f, 1.0f);
            float color_quality_power_mul = 1.0f;
            float alpha_quality_power_mul = 1.0f;
            if (m_has_etc_color_blocks)
            {
                color_quality_power_mul = m_has_subblocks ? 1.31f : 0.7f;
                params.m_adaptive_tile_color_psnr_derating = m_has_subblocks ? 5.0f : 2.0f;
            }
            if (m_pParams->m_format == cCRNFmtDXT5_CCxY)
            {
                color_quality_power_mul = 3.5f;
                alpha_quality_power_mul = .35f;
                params.m_adaptive_tile_color_psnr_derating = 5.0f;
            }
            else if (m_pParams->m_format == cCRNFmtDXT5)
            {
                color_quality_power_mul = .75f;
            }
            else if (m_pParams->m_format == cCRNFmtETC2A)
            {
                alpha_quality_power_mul = .9f;
            }

            float color_endpoint_quality = powf(quality, 1.8f * color_quality_power_mul);
            float color_selector_quality = powf(quality, 1.65f * color_quality_power_mul);
            params.m_color_endpoint_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(64, cCRNMinPaletteSize), (float)max_codebook_entries, color_endpoint_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_color_selector_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(96, cCRNMinPaletteSize), (float)max_codebook_entries, color_selector_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);

            float alpha_endpoint_quality = powf(quality, 2.1f * alpha_quality_power_mul);
            float alpha_selector_quality = powf(quality, 1.65f * alpha_quality_power_mul);
            params.m_alpha_endpoint_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(24, cCRNMinPaletteSize), (float)max_codebook_entries, alpha_endpoint_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_alpha_selector_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(48, cCRNMinPaletteSize), (float)max_codebook_entries, alpha_selector_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
        }

        if (m_pParams->m_flags & cCRNCompFlagDebugging)
        {
            console::debug("Color endpoints: %u", params.m_color_endpoint_codebook_size);
            console::debug("Color selectors: %u", params.m_color_selector_codebook_size);
            console::debug("Alpha endpoints: %u", params.m_alpha_endpoint_codebook_size);
            console::debug("Alpha selectors: %u", params.m_alpha_selector_codebook_size);
        }

        params.m_hierarchical = (m_pParams->m_flags & cCRNCompFlagHierarchical) != 0;
        params.m_perceptual = (m_pParams->m_flags & cCRNCompFlagPerceptual) != 0;

        params.m_pProgress_func = m_pParams->m_pProgress_func;
        params.m_pProgress_func_data = m_pParams->m_pProgress_func_data;

        switch (m_pParams->m_format)
        {
        case cCRNFmtDXT1:
        {
            params.m_format = cDXT1;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtDXT3:
        {
            m_has_comp[cAlpha0] = true;
            return false;
        }
        case cCRNFmtDXT5:
        {
            params.m_format = cDXT5;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            break;
        }
        case cCRNFmtDXT5_CCxY:
        {
            params.m_format = cDXT5;
            params.m_alpha_component_indices[0] = 3;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            params.m_perceptual = false;

            //params.m_adaptive_tile_color_alpha_weighting_ratio = 1.0f;
            params.m_adaptive_tile_color_alpha_weighting_ratio = 1.5f;
            break;
        }
        case cCRNFmtDXT5_xGBR:
        case cCRNFmtDXT5_AGBR:
        case cCRNFmtDXT5_xGxR:
        {
            params.m_format = cDXT5;
            params.m_alpha_component_indices[0] = 3;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtDXN_XY:
        {
            params.m_format = cDXN_XY;
            params.m_alpha_component_indices[0] = 0;
            params.m_alpha_component_indices[1] = 1;
            m_has_comp[cAlpha0] = true;
            m_has_comp[cAlpha1] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtDXN_YX:
        {
            params.m_format = cDXN_YX;
            params.m_alpha_component_indices[0] = 1;
            params.m_alpha_component_indices[1] = 0;
            m_has_comp[cAlpha0] = true;
            m_has_comp[cAlpha1] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtDXT5A:
        {
            params.m_format = cDXT5A;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cAlpha0] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtETC1:
        {
            params.m_format = cETC1;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtETC2:
        {
            params.m_format = cETC2;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtETC2A:
        {
            params.m_format = cETC2A;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            break;
        }
        case cCRNFmtETC1S:
        {
            params.m_format = cETC1S;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtETC2AS:
        {
            params.m_format = cETC2AS;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            break;
        }
        default:
        {
            return false;
        }
        }
        params.m_debugging = (m_pParams->m_flags & cCRNCompFlagDebugging) != 0;
        params.m_pTask_pool = &m_task_pool;

        params.m_num_levels = m_pParams->m_levels;
        for (uint i = 0; i < m_pParams->m_levels; i++)
        {
            params.m_levels[i].m_first_block = m_levels[i].first_block;
            params.m_levels[i].m_num_blocks = m_levels[i].num_blocks;
            params.m_levels[i].m_block_width = m_levels[i].block_width;
            params.m_levels[i].m_weight = math::minimum(12.0f, powf(1.3f, (float)i));
        }
        params.m_num_faces = m_pParams->m_faces;
        params.m_num_blocks = m_total_blocks;
        color_quad_u8(*blocks)[16] = (color_quad_u8(*)[16])crnlib_malloc(params.m_num_blocks * 16 * sizeof(color_quad_u8));
        for (uint b = 0, level = 0; level < m_pParams->m_levels; level++)
        {
            for (uint face = 0; face < m_pParams->m_faces; face++)
            {
                image_u8& image = m_images[face][level];
                uint width = image.get_width();
                uint height = image.get_height();
                uint blockWidth = ((width + 7) & ~7) >> 2;
                uint blockHeight = ((height + 7) & ~7) >> 2;
                for (uint by = 0; by < blockHeight; by++)
                {
                    for (uint y0 = by << 2, bx = 0; bx < blockWidth; bx++, b++)
                    {
                        for (uint t = 0, x0 = bx << 2, dy = 0; dy < 4; dy++)
                        {
                            for (uint y = math::minimum<uint>(y0 + dy, height - 1), dx = 0; dx < 4; dx++, t++)
                            {
                                blocks[b][t] = image(math::minimum<uint>(x0 + dx, width - 1), y);
                            }
                        }
                    }
                }
            }
        }
        bool result = m_hvq.compress(blocks, m_endpoint_indices, m_selector_indices, m_color_endpoints, m_alpha_endpoints, m_color_selectors, m_alpha_selectors, params);
        crnlib_free(blocks);

        return result;
    }